

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O0

BrailleCanvas * __thiscall
plot::BrailleCanvas::line(BrailleCanvas *this,Color *color,Point from,Point to,TerminalOp op)

{
  Rect rct;
  long lVar1;
  BrailleCanvas *pBVar2;
  anon_class_32_4_3ac4ecb1 local_d0;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long gcd;
  long dy;
  long dx;
  undefined1 local_58 [8];
  GenericRect<long> sorted;
  Color *color_local;
  BrailleCanvas *this_local;
  Point to_local;
  Point from_local;
  
  to_local.x = to.y;
  this_local = (BrailleCanvas *)to.x;
  to_local.y = from.x;
  sorted.p2.y = (long)color;
  GenericRect<long>::GenericRect
            ((GenericRect<long> *)&dx,(GenericPoint<long> *)&to_local.y,
             (GenericPoint<long> *)&this_local);
  GenericRect<long>::sorted_x((GenericRect<long> *)local_58,(GenericRect<long> *)&dx);
  dy = (sorted.p1.y - (long)local_58) + 1;
  lVar1 = sorted.p2.x - sorted.p1.x;
  gcd = (int)((uint)(-1 < lVar1) - (uint)(lVar1 < 0)) + lVar1;
  local_90 = utils::gcd<long>(dy,gcd);
  local_d0.dx = dy / local_90;
  local_d0.dy = gcd / local_90;
  local_b0 = (long)local_58;
  local_a8 = sorted.p1.x;
  local_a0 = sorted.p1.y;
  local_98 = sorted.p2.x;
  local_d0.x0 = (long)local_58;
  local_d0.y0 = sorted.p1.x;
  rct.p1.y = sorted.p1.x;
  rct.p1.x = (long)local_58;
  rct.p2.x = sorted.p1.y;
  rct.p2.y = sorted.p2.x;
  gcd = local_d0.dy;
  dy = local_d0.dx;
  pBVar2 = stroke<plot::BrailleCanvas::line(plot::Color_const&,plot::GenericPoint<long>,plot::GenericPoint<long>,plot::TerminalOp)::_lambda(long)_1_>
                     (this,(Color *)sorted.p2.y,rct,&local_d0,op);
  return pBVar2;
}

Assistant:

BrailleCanvas& line(Color const& color, Point from, Point to, TerminalOp op = TerminalOp::Over) {
        auto sorted = Rect(from, to).sorted_x();
        auto dx = (sorted.p2.x - sorted.p1.x) + 1,
             dy = sorted.p2.y - sorted.p1.y;

        dy += (dy >= 0) - (dy < 0);

        auto gcd = utils::gcd(dx, dy);
        dx /= gcd; dy /= gcd;

        return stroke(color, sorted, [dx, dy, x0 = sorted.p1.x, y0 = sorted.p1.y](Coord x) {
            auto base = (x - x0)*dy/dx + y0,
                 end_ = (1 + x - x0)*dy/dx + y0;
            return (base != end_) ? std::make_pair(base, end_) : std::make_pair(base, base+1);
        }, op);
    }